

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WriteSignedBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  size_t size;
  StackVar *args;
  char (*u) [3];
  Opcode local_94;
  StackVar local_90;
  StackVar local_84;
  Info local_78;
  
  local_94.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_78,&local_94);
  Opcode::GetInfo(&local_78,&local_94);
  Opcode::GetInfo(&local_78,&local_94);
  if (local_78.param_types[1] == local_78.param_types[0]) {
    local_78.name._0_4_ = 1;
    local_78._4_8_ = local_78.result_type;
    local_84.index = 1;
    local_84.type.enum_ = Any;
    local_84.type.type_index_ = 0;
    args = &local_90;
    local_90.index = 0;
    local_90.type.enum_ = Any;
    local_90.type.type_index_ = 0;
    Write(this,(StackVar *)&local_78);
    WriteData(this," = (",4);
    Write(this,local_78.param_types[0]);
    WriteData(this,")((",3);
    Write(this,(SignedType)local_78.param_types[0]);
    WriteData(this,")",1);
    Write(this,&local_84);
    WriteData(this," ",1);
    size = strlen(op);
    WriteData(this,op,size);
    WriteData(this," (",2);
    Write(this,(SignedType)local_78.param_types[0]);
    WriteData(this,")",1);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,&local_90,u,(Newline *)args);
    DropTypes(this,2);
    PushType(this,local_78.result_type);
    return;
  }
  __assert_fail("opcode.GetParamType2() == type",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0x10d6,
                "void wabt::(anonymous namespace)::CWriter::WriteSignedBinaryExpr(Opcode, const char *)"
               );
}

Assistant:

void CWriter::WriteSignedBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Type type = opcode.GetParamType1();
  assert(opcode.GetParamType2() == type);
  Write(StackVar(1, result_type), " = (", type, ")((", SignedType(type), ")",
        StackVar(1), " ", op, " (", SignedType(type), ")", StackVar(0), ");",
        Newline());
  DropTypes(2);
  PushType(result_type);
}